

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O3

int report(lua_State *L,int status)

{
  int iVar1;
  
  if (status != 0) {
    iVar1 = lua_type(L,0xffffffff);
    if (iVar1 != 0) {
      report_cold_1();
    }
  }
  return status;
}

Assistant:

static int report(lua_State *L, int status)
{
  if (status && !lua_isnil(L, -1)) {
    const char *msg = lua_tostring(L, -1);
    if (msg == NULL) msg = "(error object is not a string)";
    l_message(progname, msg);
    lua_pop(L, 1);
  }
  return status;
}